

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O2

int __thiscall
pg::Verifier::verify
          (Verifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int i;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  void *pvVar4;
  void *pvVar5;
  _Elt_pointer piVar6;
  ulong uVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  Game *pGVar14;
  uint uVar15;
  Verifier *pVVar16;
  long lVar17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __tmp;
  Game *pGVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  int v;
  Verifier *local_c0;
  uint local_b8;
  uint local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  int to;
  undefined4 uStack_8c;
  int local_88;
  stack<int,_std::deque<int,_std::allocator<int>_>_> st;
  
  local_ac = (undefined4)siglen;
  local_b0 = SUB84(sig,0);
  local_b8 = (uint)ctx;
  Game::ensure_sorted(this->game);
  Game::build_in_array(this->game,false);
  uVar7 = this->game->n_vertices;
  uVar20 = (uint)uVar7;
  uVar12 = (ulong)(~((int)uVar20 >> 0x1f) & uVar20);
  local_c0 = this;
  for (uVar23 = 0; pVVar16 = local_c0, uVar23 != uVar12; uVar23 = uVar23 + 1) {
    if (((local_c0->game->solved)._bits[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) == 0) {
      if ((char)local_b8 != '\0') {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"not every vertex is won");
        goto LAB_0013ff6b;
      }
    }
    else {
      iVar22 = (int)uVar23;
      iVar2 = Game::getWinner(local_c0->game,iVar22);
      pVVar16 = local_c0;
      bVar1 = iVar2 != 0;
      if ((byte)((iVar2 == 0 | (byte)local_ac) & (bVar1 | (byte)local_b0)) == 1) {
        uVar3 = Game::owner(local_c0->game,iVar22);
        pGVar14 = pVVar16->game;
        uVar15 = (uint)bVar1;
        if (uVar3 == uVar15) {
          iVar2 = pGVar14->strategy[uVar23];
          uVar19 = (ulong)iVar2;
          if (uVar19 == 0xffffffffffffffff) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"winning vertex has no strategy");
LAB_0013ff6b:
            __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          bVar1 = Game::has_edge(pGVar14,iVar22,iVar2);
          if (!bVar1) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"strategy is not a valid move");
            goto LAB_0013ff6b;
          }
          if ((((local_c0->game->solved)._bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) ||
             (uVar3 = Game::getWinner(local_c0->game,iVar2), uVar3 != uVar15)) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"strategy leaves dominion");
            goto LAB_0013ff6b;
          }
          local_c0->n_strategies = local_c0->n_strategies + 1;
        }
        else {
          piVar11 = pGVar14->_outedges + pGVar14->_firstouts[uVar23];
LAB_0013fb5f:
          iVar2 = *piVar11;
          uVar19 = (ulong)iVar2;
          pGVar14 = local_c0->game;
          if (uVar19 != 0xffffffffffffffff) {
            if (((pGVar14->solved)._bits[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)
            goto code_r0x0013fb8d;
            goto LAB_0013fef7;
          }
          if (pGVar14->strategy[uVar23] != -1) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar9,"losing vertex has strategy");
            goto LAB_0013ff6b;
          }
        }
      }
    }
  }
  pvVar4 = operator_new__(-(ulong)((ulong)(long)(int)uVar20 >> 0x3e != 0) |
                          (long)(uVar7 << 0x20) >> 0x1e);
  pvVar5 = operator_new__(-(ulong)((ulong)(long)(int)uVar20 >> 0x3d != 0) |
                          (long)(uVar7 << 0x20) >> 0x1d);
  for (uVar23 = 0; uVar12 != uVar23; uVar23 = uVar23 + 1) {
    *(undefined4 *)((long)pvVar4 + uVar23 * 4) = 0xffffffff;
  }
  for (uVar23 = 0; uVar12 != uVar23; uVar23 = uVar23 + 1) {
    *(undefined8 *)((long)pvVar5 + uVar23 * 8) = 0;
  }
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&st);
  lVar13 = 0;
  while( true ) {
    local_b4 = (int)uVar7 - 1;
    if ((int)uVar7 < 1) {
      operator_delete__(pvVar4);
      operator_delete__(pvVar5);
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                ((_Deque_base<int,_std::allocator<int>_> *)&st);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
      return extraout_EAX;
    }
    pGVar14 = pVVar16->game;
    lVar21 = lVar13;
    if (((pGVar14->solved)._bits[local_b4 >> 6] >> ((ulong)local_b4 & 0x3f) & 1) != 0) break;
LAB_0013feb7:
    uVar7 = (ulong)local_b4;
    lVar13 = lVar21;
  }
  uVar20 = pGVar14->_priority[local_b4];
  uVar3 = Game::getWinner(pGVar14,local_b4);
  if ((((byte)((uVar3 != 0 | (byte)local_b0) & (uVar3 != 1 | (byte)local_ac)) == 0) ||
      (local_b8 = uVar20 & 1, uVar3 == local_b8)) ||
     (*(uint *)((long)pvVar4 + (long)(int)local_b4 * 4) == uVar20)) goto LAB_0013feb7;
  std::deque<int,_std::allocator<int>_>::push_back(&st.c,(value_type_conflict3 *)&local_b4);
LAB_0013fccd:
  if (st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_cur == st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur) goto LAB_0013feb7;
  piVar6 = st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
      _M_cur == st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_first) {
    piVar6 = st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_node[-1] + 0x80;
  }
  v = piVar6[-1];
  lVar10 = (long)v;
  uVar7 = *(ulong *)((long)pvVar5 + lVar10 * 8);
  if ((long)uVar7 <= lVar13) {
    lVar21 = lVar21 + 1;
    *(long *)((long)pvVar5 + lVar10 * 8) = lVar21;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_a8,&v);
    lVar10 = (long)v;
    uVar7 = *(ulong *)((long)pvVar5 + lVar10 * 8);
  }
  iVar2 = (int)uVar7;
  pGVar14 = pVVar16->game;
  lVar17 = (long)pGVar14->strategy[lVar10];
  if (lVar17 == -1) goto LAB_0013fe16;
  _to = (Game *)CONCAT44(uStack_8c,pGVar14->strategy[lVar10]);
  if ((pGVar14->_priority[lVar17] <= (int)uVar20) &&
     (*(uint *)((long)pvVar4 + lVar17 * 4) != uVar20)) {
    uVar12 = *(ulong *)((long)pvVar5 + lVar17 * 8);
    if (lVar13 < (long)uVar12) {
      if ((long)iVar2 <= (long)uVar12) {
        uVar12 = uVar7;
      }
      iVar2 = (int)uVar12;
      goto LAB_0013fd70;
    }
    std::deque<int,_std::allocator<int>_>::push_back(&st.c,&to);
    goto LAB_0013fccd;
  }
LAB_0013fd70:
  lVar10 = (long)v;
  if ((long)iVar2 < *(long *)((long)pvVar5 + lVar10 * 8)) {
    *(long *)((long)pvVar5 + lVar10 * 8) = (long)iVar2;
    std::deque<int,_std::allocator<int>_>::pop_back(&st.c);
    goto LAB_0013fccd;
  }
  pGVar14 = pVVar16->game;
  iVar2 = 0;
  uVar3 = 0xffffffff;
  pGVar18 = (Game *)local_a8._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pGVar18 == (Game *)local_a8._M_impl.super__Vector_impl_data._M_start) break;
    iVar22 = *(int *)((long)&pGVar18[-1].generator.i + 4);
    pGVar18 = (Game *)((long)&pGVar18[-1].generator.i + 4);
    uVar15 = pGVar14->_priority[iVar22];
    *(uint *)((long)pvVar4 + (long)iVar22 * 4) = uVar20;
    if ((int)uVar3 < (int)uVar15) {
      uVar3 = uVar15;
    }
    iVar2 = iVar2 + 1;
  } while (iVar22 != v);
  iVar22 = v;
  if ((iVar2 < 2) && (pGVar14->strategy[lVar10] != v)) {
    if ((pGVar14->strategy[lVar10] == -1) &&
       (bVar1 = Game::has_edge(pGVar14,v,v), iVar22 = v, bVar1 && (uVar3 & 1) == local_b8)) {
LAB_0013ff81:
      poVar8 = std::operator<<(local_c0->logger,
                               "\x1b[1;31mscc where loser wins\x1b[m with priority \x1b[1;34m");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
      std::operator<<(poVar8,"\x1b[m");
      pVVar16 = local_c0;
      pGVar14 = (Game *)local_a8._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0013ffbe;
    }
  }
  else if ((uVar3 & 1) == local_b8) goto LAB_0013ff81;
  do {
    pGVar18 = (Game *)((long)&(((Game *)((long)local_a8._M_impl.super__Vector_impl_data._M_finish +
                                        -0xaa8))->generator).i + 4);
    pGVar14 = (Game *)((long)local_a8._M_impl.super__Vector_impl_data._M_finish + -0xaa8);
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)pGVar18;
  } while (*(int *)((long)&(pGVar14->generator).i + 4) != iVar22);
  std::deque<int,_std::allocator<int>_>::pop_back(&st.c);
  pVVar16 = local_c0;
  goto LAB_0013fccd;
code_r0x0013fb8d:
  uVar3 = Game::getWinner(pGVar14,iVar2);
  piVar11 = piVar11 + 1;
  if (uVar3 != uVar15) {
LAB_0013fef7:
    pVVar16 = local_c0;
    poVar8 = std::operator<<(local_c0->logger,"escape edge from ");
    st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)pVVar16->game;
    st.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_map_size.
    _0_4_ = iVar22;
    poVar8 = operator<<(poVar8,(_label_vertex *)&st);
    poVar8 = std::operator<<(poVar8," to ");
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar16->game;
    local_a8._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_a8._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar2);
    poVar8 = operator<<(poVar8,(_label_vertex *)&local_a8);
    std::endl<char,std::char_traits<char>>(poVar8);
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"loser can escape");
    goto LAB_0013ff6b;
  }
  goto LAB_0013fb5f;
LAB_0013fe16:
  piVar11 = pGVar14->_outedges + pGVar14->_firstouts[lVar10];
  while( true ) {
    iVar2 = (int)uVar7;
    lVar10 = (long)*piVar11;
    if (lVar10 == -1) break;
    _to = (Game *)CONCAT44(uStack_8c,*piVar11);
    if ((pGVar14->_priority[lVar10] <= (int)uVar20) &&
       (*(uint *)((long)pvVar4 + lVar10 * 4) != uVar20)) {
      uVar12 = *(ulong *)((long)pvVar5 + lVar10 * 8);
      if ((long)uVar12 <= lVar13) {
        std::deque<int,_std::allocator<int>_>::push_back(&st.c,&to);
        goto LAB_0013fccd;
      }
      uVar7 = uVar7 & 0xffffffff;
      if ((long)uVar12 < (long)iVar2) {
        uVar7 = uVar12 & 0xffffffff;
      }
    }
    piVar11 = piVar11 + 1;
  }
  goto LAB_0013fd70;
  while( true ) {
    iVar2 = *(int *)((long)&pGVar14[-1].generator.i + 4);
    poVar8 = std::operator<<(pVVar16->logger," ");
    _to = pVVar16->game;
    local_88 = iVar2;
    operator<<(poVar8,(_label_vertex *)&to);
    pGVar14 = (Game *)((long)&pGVar14[-1].generator.i + 4);
    if (iVar2 == v) break;
LAB_0013ffbe:
    if (pGVar14 == (Game *)local_a8._M_impl.super__Vector_impl_data._M_start) break;
  }
  std::endl<char,std::char_traits<char>>(local_c0->logger);
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"loser can win");
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Verifier::verify(bool fullgame, bool even, bool odd)
{
    // ensure the vertices are ordered properly
    game.ensure_sorted();
    // ensure that the arrays are built
    game.build_in_array(false);

    const int n_vertices = game.vertexcount();

    /**
     * The first loop removes all edges from "won" vertices that are not the strategy.
     * This turns each dominion into a single player game.
     * Also some trivial checks are performed.
     */
    for (int v=0; v < n_vertices; v++) {
        // (for full solutions) check whether every vertex is won
        if (!game.isSolved(v)) {
            if (fullgame) throw std::runtime_error("not every vertex is won");
            else continue;
        }

        const bool winner = game.getWinner(v) ;

        if (winner == 0 and !even) continue; // whatever
        if (winner == 1 and !odd) continue; // whatever

        if (winner == game.owner(v)) {
            // if winner, check whether the strategy stays in the dominion
            int str = game.getStrategy(v);
            if (str == -1) {
                throw std::runtime_error("winning vertex has no strategy");
            } else if (!game.has_edge(v, str)) {
                throw std::runtime_error("strategy is not a valid move");
            } else if (!game.isSolved(str) or game.getWinner(str) != winner) {
                throw std::runtime_error("strategy leaves dominion");
            }
            n_strategies++; // number of checked strategies
        } else {
            // if loser, check whether the loser can escape
            for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                int to = *curedge;
                if (!game.isSolved(to) or game.getWinner(to) != winner) {
                    logger << "escape edge from " << game.label_vertex(v) << " to " << game.label_vertex(to) << std::endl;
                    throw std::runtime_error("loser can escape");
                }
            }
            // and of course check that no strategy is set
            if (game.getStrategy(v) != -1) throw std::runtime_error("losing vertex has strategy");
        }
    }

    // Allocate datastructures for Tarjan search
    int *done = new int[n_vertices];
    int64_t *low = new int64_t[n_vertices];
    for (int i=0; i<n_vertices; i++) done[i] = -1;
    for (int i=0; i<n_vertices; i++) low[i] = 0;

    std::vector<int> res;
    std::stack<int> st;

    int64_t pre = 0;

    for (int top = n_vertices - 1; top >= 0; top--) {
        // only if a dominion
        if (!game.isSolved(top)) continue;

        int prio = game.priority(top);
        int winner = game.getWinner(top);

        // only compute SCC for a (probably) top vertex
        if (winner == 0 and !even) continue; // don't check even dominions
        if (winner == 1 and !odd) continue; // don't check odd dominions

        // only try to find an SCC where the loser wins
        if (winner == (prio&1)) continue;

        // only run the check if not yet done at priority <prio>
        if (done[top] == prio) continue;

        // set <bot> (in tarjan search) to current pre
        int64_t bot = pre;

        // start the tarjan search at vertex <top>
        st.push(top);

        while (!st.empty()) {
            int v = st.top();

            /**
             * When we see it for the first item, we assign the next number to it and add it to <res>.
             */
            if (low[v] <= bot) {
                low[v] = ++pre;
                res.push_back(v);
            }

            /**
             * Now we check all outgoing (allowed) edges.
             * If seen earlier, then update "min"
             * If new, then 'recurse'
             */
            int min = low[v];
            bool pushed = false;
            if (game.getStrategy(v) != -1) {
                int to = game.getStrategy(v);
                if (game.priority(to) > prio) {
                    // skip if to higher priority
                } else if (done[to] == prio) {
                    // skip if already found scc (done[to] set to prio)
                } else if (low[to] <= bot) {
                    // not visited, add to <st> and break!
                    st.push(to);
                    pushed = true;
                } else {
                    // visited, update min
                    if (low[to] < min) min = low[to];
                }
            } else {
                for (auto curedge = game.outs(v); *curedge != -1; curedge++) {
                    int to = *curedge;
                    // skip if to higher priority
                    if (game.priority(to) > prio) continue;
                    // skip if already found scc (done[to] set to prio)
                    if (done[to] == prio) continue;
                    // check if visited in this search
                    if (low[to] <= bot) {
                        // not visited, add to <st> and break!
                        st.push(to);
                        pushed = true;
                        break;
                    } else {
                        // visited, update min
                        if (low[to] < min) min = low[to];
                    }
                }
            }
            if (pushed) continue; // we pushed a new vertex to <st>...

            // there was no edge to a new vertex
            // check if we are the root of a SCC
            if (min < low[v]) {
                // not the root (outgoing edge to lower ranked vertex)
                low[v] = min;
                st.pop();
                continue;
            }

            /**
             * We're the root!
             * Now we need to figure out if we have cycles with p...
             * Also, mark every vertex in the SCC as "done @ search p"
             */
            int max_prio = -1;
            int scc_size = 0;

            for (auto it=res.rbegin(); it!=res.rend(); it++) {
                int n = *it;
                if (game.priority(n) > max_prio) max_prio = game.priority(n);
                scc_size++;
                done[n] = prio; // mark as done at prio
                if (n == v) break;
            }

            bool cycles = scc_size > 1 or game.getStrategy(v) == v or
                (game.getStrategy(v) == -1 and game.has_edge(v, v));

            if (cycles && (max_prio&1) == (prio&1)) {
                /**
                 * Found! Report.
                 */
                logger << "\033[1;31mscc where loser wins\033[m with priority \033[1;34m" << max_prio << "\033[m";
                for (auto it=res.rbegin(); it!=res.rend(); it++) {
                    int n = *it;
                    logger << " " << game.label_vertex(n);
                    if (n == v) break;
                }
                logger << std::endl;
                delete[] done;
                delete[] low;

                throw std::runtime_error("loser can win");
            }

            /**
             * Not found! Continue.
             */
            for (;;) {
                int n = res.back();
                res.pop_back();
                if (n == v) break;
            }
            st.pop();
        }
    }

    delete[] done;
    delete[] low;
}